

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample01.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pair<pybind11::handle,_pybind11::handle> pVar4;
  error_already_set *e;
  object local_3c0;
  str local_3b8;
  object local_3b0;
  undefined1 local_3a8 [8];
  handle local_3a0;
  PyObject *local_398;
  str local_390;
  object local_388 [4];
  pair<pybind11::handle,_pybind11::handle> local_368;
  PyObject *local_358;
  str local_350;
  object local_348 [4];
  pair<pybind11::handle,_pybind11::handle> local_328;
  PyObject *local_318;
  str local_310;
  object local_308 [4];
  dict_iterator local_2e8;
  undefined1 local_2c8 [8];
  dict_iterator it;
  object local_2a0 [4];
  object local_280;
  object result_1;
  object local_270 [4];
  undefined4 local_250;
  int local_24c;
  object local_248;
  object result;
  item_accessor func_03;
  object local_218;
  str local_210;
  object local_208;
  object local_200;
  undefined4 local_1f8;
  int local_1f4;
  object local_1f0;
  undefined1 local_1e8 [8];
  item_accessor func_02;
  object local_1c0;
  str local_1b8;
  object local_1b0;
  object local_1a8;
  undefined1 local_1a0 [8];
  item_accessor func_01;
  object local_178;
  str local_170;
  object local_168;
  item_accessor local_160;
  int local_13c;
  int z;
  object local_130;
  str local_128;
  object local_120;
  object local_118;
  object local_110;
  str local_108;
  object local_100;
  object local_f8;
  object local_f0;
  str local_e8;
  object local_e0;
  item_accessor local_d8;
  int local_b4;
  object local_b0;
  object local_a8;
  str local_a0;
  object local_98;
  object local_90;
  object local_88;
  str local_80;
  object local_78;
  object local_70;
  dict local;
  module local_58;
  str_attr_accessor local_50;
  object local_30;
  object local_28;
  dict global;
  wchar_t *program;
  char **argv_local;
  int argc_local;
  
  global.super_object.super_handle.m_ptr = (object)Py_DecodeLocale(*argv,0);
  if (global.super_object.super_handle.m_ptr == (handle)0x0) {
    fprintf(_stderr,"Fatal error: cannot decode argv[0]\n");
    exit(1);
  }
  Py_SetProgramName(global.super_object.super_handle.m_ptr);
  Py_Initialize();
  pybind11::module::import(&local_58,"__main__");
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_50,(object_api<pybind11::handle> *)&local_58,"__dict__");
  pybind11::detail::accessor::operator_cast_to_object((accessor *)&local_30);
  pybind11::dict::dict((dict *)&local_28,&local_30);
  pybind11::object::~object(&local_30);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_50);
  pybind11::module::~module(&local_58);
  pybind11::dict::dict((dict *)&local_70);
  pybind11::str::str(&local_80,"from time import time,ctime");
  pybind11::object::object(&local_88,&local_28);
  pybind11::object::object(&local_90,&local_70);
  pybind11::eval<(pybind11::eval_mode)1>((pybind11 *)&local_78,&local_80,&local_88,&local_90);
  pybind11::object::~object(&local_78);
  pybind11::object::~object(&local_90);
  pybind11::object::~object(&local_88);
  pybind11::str::~str(&local_80);
  pybind11::str::str(&local_a0,"print(\'Today is\', ctime(time()))");
  pybind11::object::object(&local_a8,&local_28);
  pybind11::object::object(&local_b0,&local_70);
  pybind11::eval<(pybind11::eval_mode)0>((pybind11 *)&local_98,&local_a0,&local_a8,&local_b0);
  pybind11::object::~object(&local_98);
  pybind11::object::~object(&local_b0);
  pybind11::object::~object(&local_a8);
  pybind11::str::~str(&local_a0);
  local_b4 = 100;
  pybind11::detail::object_api<pybind11::handle>::operator[]
            (&local_d8,(object_api<pybind11::handle> *)&local_70,"x");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::operator=
            (&local_d8,&local_b4);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
            (&local_d8);
  pybind11::str::str(&local_e8,"y = 200");
  pybind11::object::object(&local_f0,&local_28);
  pybind11::object::object(&local_f8,&local_70);
  pybind11::eval<(pybind11::eval_mode)1>((pybind11 *)&local_e0,&local_e8,&local_f0,&local_f8);
  pybind11::object::~object(&local_e0);
  pybind11::object::~object(&local_f8);
  pybind11::object::~object(&local_f0);
  pybind11::str::~str(&local_e8);
  pybind11::str::str(&local_108,"print(\'x + y =\', x + y)");
  pybind11::object::object(&local_110,&local_28);
  pybind11::object::object(&local_118,&local_70);
  pybind11::eval<(pybind11::eval_mode)0>((pybind11 *)&local_100,&local_108,&local_110,&local_118);
  pybind11::object::~object(&local_100);
  pybind11::object::~object(&local_118);
  pybind11::object::~object(&local_110);
  pybind11::str::~str(&local_108);
  pybind11::str::str(&local_128,"z = x + y");
  pybind11::object::object(&local_130,&local_28);
  pybind11::object::object((object *)&stack0xfffffffffffffec8,&local_70);
  pybind11::eval<(pybind11::eval_mode)1>
            ((pybind11 *)&local_120,&local_128,&local_130,(object *)&stack0xfffffffffffffec8);
  pybind11::object::~object(&local_120);
  pybind11::object::~object((object *)&stack0xfffffffffffffec8);
  pybind11::object::~object(&local_130);
  pybind11::str::~str(&local_128);
  pybind11::detail::object_api<pybind11::handle>::operator[]
            (&local_160,(object_api<pybind11::handle> *)&local_70,"z");
  iVar2 = pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::cast<int>
                    (&local_160);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
            (&local_160);
  local_13c = iVar2;
  poVar3 = std::operator<<((ostream *)&std::cout,"cpp: z = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_13c);
  std::operator<<(poVar3,"\n");
  pybind11::str::str(&local_170,"def func_01():\n\tprint(\'func_01: call\')\n");
  pybind11::object::object(&local_178,&local_28);
  pybind11::object::object(&func_01.cache,&local_70);
  pybind11::eval<(pybind11::eval_mode)2>
            ((pybind11 *)&local_168,&local_170,&local_178,&func_01.cache);
  pybind11::object::~object(&local_168);
  pybind11::object::~object(&func_01.cache);
  pybind11::object::~object(&local_178);
  pybind11::str::~str(&local_170);
  pybind11::detail::object_api<pybind11::handle>::operator[]
            ((item_accessor *)local_1a0,(object_api<pybind11::handle> *)&local_70,"func_01");
  pybind11::detail::
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
              *)&local_1a8);
  pybind11::object::~object(&local_1a8);
  pybind11::str::str(&local_1b8,
                     "def func_02(a, b):\n\tprint(\'func_02: {} + {} = {}\'.format(a, b, a + b))\n")
  ;
  pybind11::object::object(&local_1c0,&local_28);
  pybind11::object::object(&func_02.cache,&local_70);
  pybind11::eval<(pybind11::eval_mode)2>
            ((pybind11 *)&local_1b0,&local_1b8,&local_1c0,&func_02.cache);
  pybind11::object::~object(&local_1b0);
  pybind11::object::~object(&func_02.cache);
  pybind11::object::~object(&local_1c0);
  pybind11::str::~str(&local_1b8);
  pybind11::detail::object_api<pybind11::handle>::operator[]
            ((item_accessor *)local_1e8,(object_api<pybind11::handle> *)&local_70,"func_02");
  local_1f4 = 0x7b;
  local_1f8 = 0x1c8;
  pybind11::detail::
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
              *)&local_1f0,(int *)local_1e8,&local_1f4);
  pybind11::object::~object(&local_1f0);
  pybind11::detail::
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
              *)&local_200,(char (*) [4])local_1e8,(char (*) [4])"abc");
  pybind11::object::~object(&local_200);
  pybind11::str::str(&local_210,"def func_03(a, b):\n\treturn a + b\n");
  pybind11::object::object(&local_218,&local_28);
  pybind11::object::object(&func_03.cache,&local_70);
  pybind11::eval<(pybind11::eval_mode)2>
            ((pybind11 *)&local_208,&local_210,&local_218,&func_03.cache);
  pybind11::object::~object(&local_208);
  pybind11::object::~object(&func_03.cache);
  pybind11::object::~object(&local_218);
  pybind11::str::~str(&local_210);
  pybind11::detail::object_api<pybind11::handle>::operator[]
            ((item_accessor *)&result,(object_api<pybind11::handle> *)&local_70,"func_03");
  local_24c = 0x7b;
  local_250 = 0x1c8;
  pybind11::detail::
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
              *)&local_248,(int *)&result,&local_24c);
  poVar3 = std::operator<<((ostream *)&std::cout,"cpp: func_03 result ");
  pybind11::str::str((str *)&result_1,&local_248);
  pybind11::object::cast<std::__cxx11::string>(local_270);
  poVar3 = std::operator<<(poVar3,(string *)local_270);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)local_270);
  pybind11::str::~str((str *)&result_1);
  pybind11::object::~object(&local_248);
  pybind11::detail::
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
              *)&local_280,(char (*) [4])&result,(char (*) [4])"abc");
  poVar3 = std::operator<<((ostream *)&std::cout,"cpp: func_03 result ");
  pybind11::str::str((str *)&it.pos,&local_280);
  pybind11::object::cast<std::__cxx11::string>(local_2a0);
  poVar3 = std::operator<<(poVar3,(string *)local_2a0);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)local_2a0);
  pybind11::str::~str((str *)&it.pos);
  pybind11::object::~object(&local_280);
  std::operator<<((ostream *)&std::cout,"\n\nAll local variable.\n");
  pybind11::dict::begin((dict_iterator *)local_2c8,(dict *)&local_70);
  while( true ) {
    pybind11::dict::end(&local_2e8,(dict *)&local_70);
    bVar1 = pybind11::detail::dict_iterator::operator!=((dict_iterator *)local_2c8,&local_2e8);
    if (!bVar1) break;
    pVar4 = pybind11::detail::dict_iterator::operator*((dict_iterator *)local_2c8);
    local_318 = (PyObject *)pVar4.first.m_ptr;
    local_328 = pVar4;
    pybind11::str::str(&local_310,(handle)local_318);
    pybind11::object::cast<std::__cxx11::string>(local_308);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_308);
    std::operator<<(poVar3," : ");
    std::__cxx11::string::~string((string *)local_308);
    pybind11::str::~str(&local_310);
    pVar4 = pybind11::detail::dict_iterator::operator*((dict_iterator *)local_2c8);
    local_358 = (PyObject *)pVar4.second.m_ptr;
    local_368 = pVar4;
    pybind11::str::str(&local_350,(handle)local_358);
    pybind11::object::cast<std::__cxx11::string>(local_348);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_348);
    std::operator<<(poVar3," : ");
    std::__cxx11::string::~string((string *)local_348);
    pybind11::str::~str(&local_350);
    pVar4 = pybind11::detail::dict_iterator::operator*((dict_iterator *)local_2c8);
    _local_3a8 = pVar4;
    local_398 = (PyObject *)
                pybind11::detail::object_api<pybind11::handle>::get_type
                          ((object_api<pybind11::handle> *)(local_3a8 + 8));
    pybind11::str::str(&local_390,(handle)local_398);
    pybind11::object::cast<std::__cxx11::string>(local_388);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_388);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)local_388);
    pybind11::str::~str(&local_390);
    pybind11::detail::dict_iterator::operator++((dict_iterator *)local_2c8);
  }
  pybind11::str::str(&local_3b8,"sample01.py");
  pybind11::object::object(&local_3c0,&local_28);
  pybind11::object::object((object *)&e,&local_70);
  pybind11::eval_file<(pybind11::eval_mode)2>
            ((pybind11 *)&local_3b0,&local_3b8,&local_3c0,(object *)&e);
  pybind11::object::~object(&local_3b0);
  pybind11::object::~object((object *)&e);
  pybind11::object::~object(&local_3c0);
  pybind11::str::~str(&local_3b8);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
            ((accessor<pybind11::detail::accessor_policies::generic_item> *)&result);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
            ((accessor<pybind11::detail::accessor_policies::generic_item> *)local_1e8);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
            ((accessor<pybind11::detail::accessor_policies::generic_item> *)local_1a0);
  pybind11::dict::~dict((dict *)&local_70);
  pybind11::dict::~dict((dict *)&local_28);
  Py_Finalize();
  PyMem_RawFree(global.super_object.super_handle.m_ptr);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	wchar_t* program = Py_DecodeLocale(argv[0], nullptr);
	if (program == nullptr) {
		fprintf(stderr, "Fatal error: cannot decode argv[0]\n");
		exit(1);
	}
	Py_SetProgramName(program);
	Py_Initialize();

	try {
		auto global = py::dict(py::module::import("__main__").attr("__dict__"));
		auto local = py::dict();

		// http://docs.python.jp/3.5/extending/embedding.html のサンプルを
		// pybind11 で記述
		py::eval<py::eval_single_statement>(
			"from time import time,ctime", global, local);
		py::eval("print('Today is', ctime(time()))", global, local);

		// 変数の定義
		local["x"] = 100;
		py::eval<py::eval_single_statement>("y = 200", global, local);
		py::eval("print('x + y =', x + y)", global, local);

		// 値の取得
		py::eval<py::eval_single_statement>("z = x + y", global, local);
		auto z = local["z"].cast<int>();
		std::cout << "cpp: z = " << z << "\n";

		// 関数定義と呼び出し
		py::eval<py::eval_statements>(
			"def func_01():\n"
			"	print('func_01: call')\n",
			global, local);
		auto func_01 = local["func_01"];
		func_01();

		// 関数へ引数を渡す
		py::eval<py::eval_statements>(
			"def func_02(a, b):\n"
			"	print('func_02: {} + {} = {}'.format(a, b, a + b))\n",
			global, local);
		auto func_02 = local["func_02"];
		func_02(123, 456);
		func_02("abc", "efg");

		// 関数の戻り値を取得する
		py::eval<py::eval_statements>(
			"def func_03(a, b):\n"
			"	return a + b\n",
			global, local);
		auto func_03 = local["func_03"];
		{
			auto result = func_03(123, 456);
			std::cout << "cpp: func_03 result "
					  << py::str(result).cast<std::string>() << "\n";
		}
		{
			auto result = func_03("abc", "def");
			std::cout << "cpp: func_03 result "
					  << py::str(result).cast<std::string>() << "\n";
		}

		std::cout << "\n\nAll local variable.\n";
		for (auto it = local.begin(); it != local.end(); ++it) {
			std::cout << py::str((*it).first).cast<std::string>() << " : ";
			std::cout << py::str((*it).second).cast<std::string>() << " : ";
			std::cout << py::str((*it).second.get_type()).cast<std::string>()
					  << "\n";
		}

		py::eval_file("sample01.py", global, local);
	} catch (py::error_already_set& e) {
		std::cout << "Python error.\n" << e.what() << "\n";
	}

	Py_Finalize();
	PyMem_RawFree(program);

	return 0;
}